

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocumentContext.cpp
# Opt level: O0

EStatusCode __thiscall
PDFHummus::DocumentContext::WriteTrailerDictionaryValues
          (DocumentContext *this,DictionaryContext *inDictionaryContext)

{
  IndirectObjectsReferenceRegistry *this_00;
  ObjectIDType inValue;
  Trace *this_01;
  ulong uVar1;
  BoolAndLongFilePositionType BVar2;
  string local_98;
  BoolAndObjectReference local_78;
  BoolAndObjectReference local_60;
  undefined1 local_48 [8];
  BoolAndObjectReference objectIDResult;
  BoolAndLongFilePositionType filePositionResult;
  EStatusCode status;
  DictionaryContext *inDictionaryContext_local;
  DocumentContext *this_local;
  
  filePositionResult.second._4_4_ = eSuccess;
  DictionaryContext::WriteKey(inDictionaryContext,&scSize_abi_cxx11_);
  this_00 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
  inValue = IndirectObjectsReferenceRegistry::GetObjectsCount(this_00);
  DictionaryContext::WriteIntegerValue(inDictionaryContext,inValue);
  BVar2 = TrailerInformation::GetPrev(&this->mTrailerInformation);
  objectIDResult.second.GenerationNumber._0_1_ = BVar2.first;
  if (((undefined1  [16])BVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    DictionaryContext::WriteKey(inDictionaryContext,&scPrev_abi_cxx11_);
    DictionaryContext::WriteIntegerValue(inDictionaryContext,BVar2.second);
  }
  TrailerInformation::GetRoot((BoolAndObjectReference *)local_48,&this->mTrailerInformation);
  if ((local_48[0] & 1U) == 0) {
    this_01 = Trace::DefaultTrace();
    Trace::TraceToLog(this_01,
                      "DocumentContext::WriteTrailerDictionaryValues, Unexpected Failure. Didn\'t find catalog object while writing trailer"
                     );
    filePositionResult.second._4_4_ = eFailure;
  }
  else {
    DictionaryContext::WriteKey(inDictionaryContext,&scRoot_abi_cxx11_);
    DictionaryContext::WriteObjectReferenceValue
              (inDictionaryContext,(ObjectReference *)&objectIDResult);
    TrailerInformation::GetEncrypt(&local_60,&this->mTrailerInformation);
    std::pair<bool,_ObjectReference>::operator=((pair<bool,_ObjectReference> *)local_48,&local_60);
    if ((local_48[0] & 1U) != 0) {
      DictionaryContext::WriteKey(inDictionaryContext,&scEncrypt_abi_cxx11_);
      DictionaryContext::WriteObjectReferenceValue
                (inDictionaryContext,(ObjectReference *)&objectIDResult);
    }
    TrailerInformation::GetInfoDictionaryReference(&local_78,&this->mTrailerInformation);
    std::pair<bool,_ObjectReference>::operator=((pair<bool,_ObjectReference> *)local_48,&local_78);
    if ((local_48[0] & 1U) != 0) {
      DictionaryContext::WriteKey(inDictionaryContext,&scInfo_abi_cxx11_);
      DictionaryContext::WriteObjectReferenceValue
                (inDictionaryContext,(ObjectReference *)&objectIDResult);
    }
    EncryptionHelper::PauseEncryption(&this->mEncryptionHelper);
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) != 0) {
      GenerateMD5IDForFile_abi_cxx11_(&local_98,this);
      std::__cxx11::string::operator=((string *)&this->mNewPDFID,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
    }
    DictionaryContext::WriteKey(inDictionaryContext,&scID_abi_cxx11_);
    ObjectsContext::StartArray(this->mObjectsContext);
    if ((this->mModifiedDocumentIDExists & 1U) == 0) {
      ObjectsContext::WriteHexString(this->mObjectsContext,&this->mNewPDFID,eTokenSeparatorSpace);
    }
    else {
      ObjectsContext::WriteHexString
                (this->mObjectsContext,&this->mModifiedDocumentID,eTokenSeparatorSpace);
    }
    ObjectsContext::WriteHexString(this->mObjectsContext,&this->mNewPDFID,eTokenSeparatorSpace);
    ObjectsContext::EndArray(this->mObjectsContext,eTokenSeparatorNone);
    ObjectsContext::EndLine(this->mObjectsContext);
    EncryptionHelper::ReleaseEncryption(&this->mEncryptionHelper);
  }
  return filePositionResult.second._4_4_;
}

Assistant:

EStatusCode DocumentContext::WriteTrailerDictionaryValues(DictionaryContext* inDictionaryContext)
{
    EStatusCode status = eSuccess;

	do
	{

		// size
		inDictionaryContext->WriteKey(scSize);
		inDictionaryContext->WriteIntegerValue(mObjectsContext->GetInDirectObjectsRegistry().GetObjectsCount());

		// prev reference
		BoolAndLongFilePositionType filePositionResult = mTrailerInformation.GetPrev();
		if(filePositionResult.first)
		{
			inDictionaryContext->WriteKey(scPrev);
			inDictionaryContext->WriteIntegerValue(filePositionResult.second);
		}

		// catalog reference
		BoolAndObjectReference objectIDResult = mTrailerInformation.GetRoot();
		if(objectIDResult.first)
		{
			inDictionaryContext->WriteKey(scRoot);
			inDictionaryContext->WriteObjectReferenceValue(objectIDResult.second);
		}
		else
		{
			TRACE_LOG("DocumentContext::WriteTrailerDictionaryValues, Unexpected Failure. Didn't find catalog object while writing trailer");
			status = PDFHummus::eFailure;
			break;
		}

		// encrypt dictionary reference
		objectIDResult = mTrailerInformation.GetEncrypt();
		if(objectIDResult.first)
		{
			inDictionaryContext->WriteKey(scEncrypt);
			inDictionaryContext->WriteObjectReferenceValue(objectIDResult.second);
		}

		// info reference
		objectIDResult = mTrailerInformation.GetInfoDictionaryReference();
		if(objectIDResult.first)
		{
			inDictionaryContext->WriteKey(scInfo);
			inDictionaryContext->WriteObjectReferenceValue(objectIDResult.second);
		}

		// write ID [must be unencrypted, in encrypted documents]
		mEncryptionHelper.PauseEncryption();

		if(mNewPDFID.empty()) // new pdf id is created prior to end in case of encryption
			mNewPDFID = GenerateMD5IDForFile();
		inDictionaryContext->WriteKey(scID);
		mObjectsContext->StartArray();

        // if modified file scenario use original ID, otherwise create a new one for the document created ID
        if(mModifiedDocumentIDExists)
            mObjectsContext->WriteHexString(mModifiedDocumentID);
        else
            mObjectsContext->WriteHexString(mNewPDFID);
		mObjectsContext->WriteHexString(mNewPDFID);
		mObjectsContext->EndArray();
		mObjectsContext->EndLine();

		mEncryptionHelper.ReleaseEncryption();

	}while(false);

	return status;
}